

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::GetOuterVariable(SQFuncState *this,SQObject *name)

{
  SQOuterVar *pSVar1;
  SQUnsignedInteger SVar2;
  SQObjectPtr local_d8;
  SQObjectPtr local_c8;
  SQOuterVar local_b8;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  SQOuterVar local_60;
  SQInteger local_38;
  SQInteger pos;
  SQInteger i;
  SQInteger outers;
  SQObject *name_local;
  SQFuncState *this_local;
  
  outers = (SQInteger)name;
  name_local = (SQObject *)this;
  i = sqvector<SQOuterVar>::size(&this->_outervalues);
  for (pos = 0; pos < i; pos = pos + 1) {
    pSVar1 = sqvector<SQOuterVar>::operator[](&this->_outervalues,pos);
    if ((pSVar1->_name).super_SQObject._unVal.pTable == *(SQTable **)(outers + 8)) {
      return pos;
    }
  }
  local_38 = 0xffffffffffffffff;
  if (this->_parent != (SQFuncState *)0x0) {
    local_38 = GetLocalVariable(this->_parent,(SQObject *)outers);
    if (local_38 != -1) {
      MarkLocalAsOuter(this->_parent,local_38);
      ::SQObjectPtr::SQObjectPtr(&local_c8,(SQObject *)outers);
      ::SQObjectPtr::SQObjectPtr(&local_d8,local_38);
      SQOuterVar::SQOuterVar(&local_b8,&local_c8,&local_d8,otLOCAL);
      sqvector<SQOuterVar>::push_back(&this->_outervalues,&local_b8);
      SQOuterVar::~SQOuterVar(&local_b8);
      ::SQObjectPtr::~SQObjectPtr(&local_d8);
      ::SQObjectPtr::~SQObjectPtr(&local_c8);
      SVar2 = sqvector<SQOuterVar>::size(&this->_outervalues);
      return SVar2 - 1;
    }
    local_38 = GetOuterVariable(this->_parent,(SQObject *)outers);
    if (local_38 != -1) {
      ::SQObjectPtr::SQObjectPtr(&local_70,(SQObject *)outers);
      ::SQObjectPtr::SQObjectPtr(&local_80,local_38);
      SQOuterVar::SQOuterVar(&local_60,&local_70,&local_80,otOUTER);
      sqvector<SQOuterVar>::push_back(&this->_outervalues,&local_60);
      SQOuterVar::~SQOuterVar(&local_60);
      ::SQObjectPtr::~SQObjectPtr(&local_80);
      ::SQObjectPtr::~SQObjectPtr(&local_70);
      SVar2 = sqvector<SQOuterVar>::size(&this->_outervalues);
      return SVar2 - 1;
    }
  }
  return -1;
}

Assistant:

SQInteger SQFuncState::GetOuterVariable(const SQObject &name)
{
    SQInteger outers = _outervalues.size();
    for(SQInteger i = 0; i<outers; i++) {
        if(_string(_outervalues[i]._name) == _string(name))
            return i;
    }
    SQInteger pos=-1;
    if(_parent) {
        pos = _parent->GetLocalVariable(name);
        if(pos == -1) {
            pos = _parent->GetOuterVariable(name);
            if(pos != -1) {
                _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otOUTER)); //local
                return _outervalues.size() - 1;
            }
        }
        else {
            _parent->MarkLocalAsOuter(pos);
            _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otLOCAL)); //local
            return _outervalues.size() - 1;


        }
    }
    return -1;
}